

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O0

void mapHeatIce(Layer *l,int *out,longlong areaX,longlong areaZ,int areaWidth,int areaHeight)

{
  int iVar1;
  int v12;
  int v01;
  int v21;
  int v10;
  int v11;
  int z;
  int x;
  int pHeight;
  int pWidth;
  int pZ;
  int pX;
  int areaHeight_local;
  int areaWidth_local;
  longlong areaZ_local;
  longlong areaX_local;
  int *out_local;
  Layer *l_local;
  
  iVar1 = areaWidth + 2;
  (*l->p->getMap)(l->p,out,(long)((int)areaX + -1),(long)((int)areaZ + -1),iVar1,areaHeight + 2);
  for (v10 = 0; v10 < areaHeight; v10 = v10 + 1) {
    for (v11 = 0; v11 < areaWidth; v11 = v11 + 1) {
      v21 = out[v11 + 1 + (v10 + 1) * iVar1];
      if (v21 == 4) {
        if (((((out[v11 + 1 + v10 * iVar1] == 1) || (out[v11 + 1 + v10 * iVar1] == 2)) ||
             (out[v11 + 2 + (v10 + 1) * iVar1] == 1)) ||
            ((out[v11 + 2 + (v10 + 1) * iVar1] == 2 || (out[v11 + (v10 + 1) * iVar1] == 1)))) ||
           ((out[v11 + (v10 + 1) * iVar1] == 2 ||
            ((out[v11 + 1 + (v10 + 2) * iVar1] == 1 || (out[v11 + 1 + (v10 + 2) * iVar1] == 2))))))
        {
          v21 = 3;
        }
      }
      out[v11 + v10 * areaWidth] = v21;
    }
  }
  return;
}

Assistant:

void mapHeatIce(Layer *l, int *__restrict out, long long areaX, long long areaZ, int areaWidth, int areaHeight) {
    int pX = (int) areaX - 1;
    int pZ = (int) areaZ - 1;
    int pWidth = areaWidth + 2;
    int pHeight = areaHeight + 2;
    int x, z;

    l->p->getMap(l->p, out, pX, pZ, pWidth, pHeight);

    for (z = 0; z < areaHeight; z++) {
        for (x = 0; x < areaWidth; x++) {
            int v11 = out[x + 1 + (z + 1) * pWidth];

            if (v11 == 4) {
                int v10 = out[x + 1 + (z + 0) * pWidth];
                int v21 = out[x + 2 + (z + 1) * pWidth];
                int v01 = out[x + 0 + (z + 1) * pWidth];
                int v12 = out[x + 1 + (z + 2) * pWidth];

                if (v10 == 1 || v10 == 2 || v21 == 1 || v21 == 2 || v01 == 1 || v01 == 2 || v12 == 1 || v12 == 2) {
                    v11 = 3;
                }
            }

            out[x + z * areaWidth] = v11;
        }
    }
}